

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

void psa_rsa_oaep_set_padding_mode(psa_algorithm_t alg,mbedtls_rsa_context *rsa)

{
  mbedtls_md_type_t hash_id;
  mbedtls_md_info_t *md_info_00;
  undefined4 local_30;
  mbedtls_md_type_t md_alg;
  mbedtls_md_info_t *md_info;
  psa_algorithm_t hash_alg;
  mbedtls_rsa_context *rsa_local;
  psa_algorithm_t alg_local;
  
  if ((alg & 0xffffff00) == 0x12030000) {
    local_30 = alg & 0xff | 0x1000000;
  }
  else {
    local_30 = 0;
  }
  md_info_00 = mbedtls_md_info_from_psa(local_30);
  hash_id = mbedtls_md_get_type(md_info_00);
  mbedtls_rsa_set_padding(rsa,1,hash_id);
  return;
}

Assistant:

static void psa_rsa_oaep_set_padding_mode( psa_algorithm_t alg,
                                           mbedtls_rsa_context *rsa )
{
    psa_algorithm_t hash_alg = PSA_ALG_RSA_OAEP_GET_HASH( alg );
    const mbedtls_md_info_t *md_info = mbedtls_md_info_from_psa( hash_alg );
    mbedtls_md_type_t md_alg = mbedtls_md_get_type( md_info );
    mbedtls_rsa_set_padding( rsa, MBEDTLS_RSA_PKCS_V21, md_alg );
}